

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O2

void __thiscall
QTextDocumentFragment::QTextDocumentFragment(QTextDocumentFragment *this,QTextDocument *document)

{
  long lVar1;
  QTextDocumentFragmentPrivate *this_00;
  long in_FS_OFFSET;
  QTextCursor cursor;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->d = (QTextDocumentFragmentPrivate *)0x0;
  if (document != (QTextDocument *)0x0) {
    cursor.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor(&cursor,document);
    QTextCursor::movePosition(&cursor,End,KeepAnchor,1);
    this_00 = (QTextDocumentFragmentPrivate *)operator_new(0x18);
    QTextDocumentFragmentPrivate::QTextDocumentFragmentPrivate(this_00,&cursor);
    this->d = this_00;
    QTextCursor::~QTextCursor(&cursor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextDocumentFragment::QTextDocumentFragment(const QTextDocument *document)
    : d(nullptr)
{
    if (!document)
        return;

    QTextCursor cursor(const_cast<QTextDocument *>(document));
    cursor.movePosition(QTextCursor::End, QTextCursor::KeepAnchor);
    d = new QTextDocumentFragmentPrivate(cursor);
}